

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O1

uint32 Clasp::StatisticObject::
       registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>(void)

{
  int iVar1;
  Array_T *local_10;
  
  if (registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()::vtab_s ==
      '\0') {
    registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>();
  }
  if (registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()::id == '\0')
  {
    iVar1 = __cxa_guard_acquire(&registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()
                                 ::id);
    if (iVar1 != 0) {
      local_10 = &registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>
                  ::vtab_s;
      bk_lib::
      pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
      ::push_back((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                   *)types_s,(I **)&local_10);
      registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>::id =
           types_s._8_4_ - 1;
      __cxa_guard_release(&registerArray<Clasp::StatsVec<Clasp::SolverStats,(Potassco::Statistics_t::E)3>>()
                           ::id);
    }
  }
  return registerArray<Clasp::StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>_>::id;
}

Assistant:

uint32 StatisticObject::registerArray() {
	static const struct Array_T : A {
		Array_T() : A(&Array_T::size, &Array_T::at) {}
		static uint32          size(ObjPtr obj)         { return toU32(static_cast<const T*>(obj)->size()); }
		static StatisticObject at(ObjPtr obj, uint32 i) { return static_cast<const T*>(obj)->at(i); }
	} vtab_s;
	static const uint32 id = registerType(&vtab_s);
	return id;
}